

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
SteamIRCCommand::trigger
          (SteamIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  undefined8 *puVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  string playerName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [40];
  _Alloc_hider local_78;
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  local_48._8_8_ = nick._M_str;
  local_48._M_allocated_capacity = nick._M_len;
  local_70 = channel._M_str;
  local_78._M_p = (pointer)channel._M_len;
  local_a0._32_8_ = source;
  lVar3 = Jupiter::IRC::Client::getChannel(source,local_78._M_p,local_70);
  if (lVar3 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    if (parameters._M_len == 0) {
      RenX::getCore();
      lVar3 = RenX::Core::getServerCount();
      if (lVar3 != 0) {
        uVar4 = 0;
        do {
          uVar6 = RenX::getCore();
          lVar3 = RenX::Core::getServer(uVar6);
          cVar2 = RenX::Server::isLogChanType((int)lVar3);
          if (cVar2 != '\0') {
            plVar7 = *(long **)(lVar3 + 0x10);
            if (plVar7 == (long *)(lVar3 + 0x10)) {
              uVar9 = 0;
              uVar8 = 0;
            }
            else {
              uVar8 = 0;
              uVar9 = 0;
              do {
                if ((char)plVar7[0x22] == '\0') {
                  uVar9 = uVar9 + 1;
                  uVar8 = (uVar8 + 1) - (uint)(plVar7[0x1f] == 0);
                }
                plVar7 = (long *)*plVar7;
              } while (plVar7 != (long *)(lVar3 + 0x10));
            }
            if (uVar9 == 0) {
              Jupiter::IRC::Client::sendMessage
                        (local_a0._32_8_,local_78._M_p,local_70,0x17,"No players are in-game.");
            }
            else {
              string_printf_abi_cxx11_
                        (&local_c0,"%.2f%% (%u/%u) of players are using Steam.",
                         ((double)uVar8 * 100.0) / (double)uVar9);
              Jupiter::IRC::Client::sendMessage
                        (local_a0._32_8_,local_78._M_p,local_70,local_c0._M_string_length,
                         local_c0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,
                                CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                         local_c0.field_2._M_local_buf[0]) + 1);
              }
            }
          }
          uVar4 = (ulong)((int)uVar4 + 1);
          RenX::getCore();
          uVar6 = RenX::Core::getServerCount();
        } while (uVar6 != uVar4);
      }
    }
    else {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      uVar9 = 0;
      while( true ) {
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        if (uVar4 == uVar9) break;
        uVar4 = RenX::getCore();
        lVar3 = RenX::Core::getServer(uVar4);
        cVar2 = RenX::Server::isLogChanType((int)lVar3);
        if (cVar2 != '\0') {
          for (puVar1 = *(undefined8 **)(lVar3 + 0x10); puVar1 != (undefined8 *)(lVar3 + 0x10);
              puVar1 = (undefined8 *)*puVar1) {
            in_string._M_str = (char *)puVar1[3];
            in_string._M_len = puVar1[4];
            sVar5 = jessilib::find<char,char,false>(in_string,parameters);
            if (sVar5 != 0xffffffffffffffff) {
              local_38._M_p = (pointer)(puVar1 + 2);
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&local_68);
              string_printf_abi_cxx11_
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,"\x0303[Steam] \x03%.*s (ID: %d) ",local_68._8_8_,
                         local_68._M_allocated_capacity,(ulong)*(uint *)((long)puVar1 + 0x10c));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_c0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a0);
              if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
                operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
              }
              if (puVar1[0x1f] == 0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_c0,"is not using steam.");
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_c0,"is using steam ID \x02");
                RenX::Server::formatSteamID_abi_cxx11_((PlayerInfo *)local_a0);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_c0,(char *)local_a0._0_8_,local_a0._8_8_);
                if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
                  operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                }
                string_printf_abi_cxx11_
                          ((string *)local_a0,
                           "\x02; Steam Profile: \x02https://steamcommunity.com/profiles/%llu\x02",
                           puVar1[0x1f]);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_c0,(char *)local_a0._0_8_,local_a0._8_8_);
                if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
                  operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                }
              }
              Jupiter::IRC::Client::sendMessage
                        (local_a0._32_8_,local_78._M_p,local_70,local_c0._M_string_length,
                         local_c0._M_dataplus._M_p);
              if ((_Alloc_hider *)local_68._M_allocated_capacity != local_58) {
                operator_delete((void *)local_68._M_allocated_capacity,(ulong)(local_58[0]._M_p + 1)
                               );
              }
            }
          }
        }
        uVar9 = uVar9 + 1;
      }
      if (local_c0._M_string_length == 0) {
        Jupiter::IRC::Client::sendNotice
                  (local_a0._32_8_,local_48._0_8_,local_48._8_8_,0x18,"Error: Player not found.");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

void SteamIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		if (!parameters.empty()) {
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, parameters) != std::string::npos) {
							std::string playerName = RenX::getFormattedPlayerName(*node);
							msg = string_printf(IRCCOLOR "03[Steam] " IRCCOLOR "%.*s (ID: %d) ", playerName.size(),
								playerName.data(), node->id);
							if (node->steamid != 0) {
								msg += "is using steam ID " IRCBOLD;
								msg += server->formatSteamID(*node);
								msg += string_printf(IRCBOLD "; Steam Profile: " IRCBOLD "https://steamcommunity.com/profiles/%llu" IRCBOLD, node->steamid);
							}
							else
								msg += "is not using steam.";

							source->sendMessage(channel, msg);
						}
					}
				}
			}
			if (msg.empty())
				source->sendNotice(nick, "Error: Player not found."sv);
		}
		else
		{
			unsigned int total;
			unsigned int realPlayers;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					total = 0;
					realPlayers = 0;
					for (auto node = server->players.begin(); node != server->players.end(); ++node)
					{
						if (node->isBot == false)
						{
							realPlayers++;
							if (node->steamid != 0)
								total++;
						}
					}

					if (realPlayers != 0)
						source->sendMessage(channel, string_printf("%.2f%% (%u/%u) of players are using Steam.", ((double)total * 100) / ((double)realPlayers), total, realPlayers));
					else
						source->sendMessage(channel, "No players are in-game."sv);
				}
			}
		}
	}
}